

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
          (locator *__return_storage_ptr__,void *this,arrays_type *arrays_,size_t pos0,size_t hash,
          try_emplace_args_t *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          ArgTokens *args_2)

{
  group15<boost::unordered::detail::foa::plain_integral> *pgVar1;
  char *pcVar2;
  undefined8 *puVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  uVar4 = *(ulong *)((long)this + 8);
  lVar8 = *(long *)((long)this + 0x10);
  lVar9 = 1;
  while( true ) {
    pgVar1 = (group15<boost::unordered::detail::foa::plain_integral> *)
             (lVar8 + (long)arrays_ * 0x10);
    pcVar2 = (char *)(lVar8 + (long)arrays_ * 0x10);
    auVar10[0] = -(*pcVar2 == '\0');
    auVar10[1] = -(pcVar2[1] == '\0');
    auVar10[2] = -(pcVar2[2] == '\0');
    auVar10[3] = -(pcVar2[3] == '\0');
    auVar10[4] = -(pcVar2[4] == '\0');
    auVar10[5] = -(pcVar2[5] == '\0');
    auVar10[6] = -(pcVar2[6] == '\0');
    auVar10[7] = -(pcVar2[7] == '\0');
    auVar10[8] = -(pcVar2[8] == '\0');
    auVar10[9] = -(pcVar2[9] == '\0');
    auVar10[10] = -(pcVar2[10] == '\0');
    auVar10[0xb] = -(pcVar2[0xb] == '\0');
    auVar10[0xc] = -(pcVar2[0xc] == '\0');
    auVar10[0xd] = -(pcVar2[0xd] == '\0');
    auVar10[0xe] = -(pcVar2[0xe] == '\0');
    auVar10[0xf] = -(pcVar2[0xf] == 0U);
    uVar6 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
    if (uVar6 != 0) break;
    pgVar1->m[0xf].n = pcVar2[0xf] | '\x01' << ((byte)pos0 & 7);
    arrays_ = (arrays_type *)((long)&arrays_->groups_size_index + lVar9 & uVar4);
    lVar9 = lVar9 + 1;
  }
  uVar5 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  lVar8 = (long)arrays_ * 600 + *(long *)((long)this + 0x18);
  lVar9 = (ulong)uVar5 * 0x28;
  uVar7 = *(undefined8 *)(hash + 8);
  *(undefined8 *)(lVar9 + lVar8) = *(undefined8 *)hash;
  ((undefined8 *)(lVar9 + lVar8))[1] = uVar7;
  uVar7 = *(undefined8 *)(args + 8);
  puVar3 = (undefined8 *)(lVar9 + 0x10 + lVar8);
  *puVar3 = *(undefined8 *)args;
  puVar3[1] = uVar7;
  *(undefined8 *)(lVar9 + 0x20 + lVar8) = *(undefined8 *)(args + 0x10);
  pgVar1->m[uVar5].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (pos0 & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar5;
  __return_storage_ptr__->p =
       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)
       (lVar8 + lVar9);
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }